

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-bit-array-type.cpp
# Opt level: O0

bool __thiscall
yactfr::FixedLengthBitArrayType::operator<
          (FixedLengthBitArrayType *this,FixedLengthBitArrayType *other)

{
  uint uVar1;
  uint uVar2;
  FixedLengthBitArrayType *other_local;
  FixedLengthBitArrayType *this_local;
  
  uVar1 = DataType::alignment((DataType *)this);
  uVar2 = DataType::alignment((DataType *)other);
  if (uVar1 < uVar2) {
    this_local._7_1_ = true;
  }
  else {
    uVar1 = DataType::alignment((DataType *)other);
    uVar2 = DataType::alignment((DataType *)this);
    if (uVar1 < uVar2) {
      this_local._7_1_ = false;
    }
    else if (this->_len < other->_len) {
      this_local._7_1_ = true;
    }
    else if (other->_len < this->_len) {
      this_local._7_1_ = false;
    }
    else if ((int)this->_bo < (int)other->_bo) {
      this_local._7_1_ = true;
    }
    else if ((int)other->_bo < (int)this->_bo) {
      this_local._7_1_ = false;
    }
    else if ((int)this->_bio < (int)other->_bio) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FixedLengthBitArrayType::operator<(const FixedLengthBitArrayType& other) const noexcept
{
    if (this->alignment() < other.alignment()) {
        return true;
    }

    if (other.alignment() < this->alignment()) {
        return false;
    }

    if (_len < other._len) {
        return true;
    }

    if (other._len < _len) {
        return false;
    }

    if (_bo < other._bo) {
        return true;
    }

    if (other._bo < _bo) {
        return false;
    }

    if (_bio < other._bio) {
        return true;
    }

    return false;
}